

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UBool __thiscall
icu_63::UnicodeString::padLeading(UnicodeString *this,int32_t targetLength,UChar padChar)

{
  short sVar1;
  UBool UVar2;
  ulong uVar3;
  UBool UVar4;
  char16_t *__src;
  uint uVar5;
  int32_t iVar6;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  uVar5 = targetLength - iVar6;
  UVar4 = '\0';
  if (uVar5 != 0 && iVar6 <= targetLength) {
    UVar2 = cloneArrayIfNeeded(this,targetLength,-1,'\x01',(int32_t **)0x0,'\0');
    UVar4 = '\0';
    if (UVar2 != '\0') {
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        __src = (this->fUnion).fFields.fArray;
      }
      else {
        __src = (char16_t *)((long)&this->fUnion + 2);
      }
      if (0 < iVar6) {
        memmove(__src + (int)uVar5,__src,(ulong)(uint)(iVar6 * 2));
      }
      for (uVar3 = (ulong)uVar5; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
        __src[uVar3 - 1] = padChar;
      }
      setLength(this,targetLength);
      UVar4 = '\x01';
    }
  }
  return UVar4;
}

Assistant:

UBool 
UnicodeString::padLeading(int32_t targetLength,
                          UChar padChar)
{
  int32_t oldLength = length();
  if(oldLength >= targetLength || !cloneArrayIfNeeded(targetLength)) {
    return FALSE;
  } else {
    // move contents up by padding width
    UChar *array = getArrayStart();
    int32_t start = targetLength - oldLength;
    us_arrayCopy(array, 0, array, start, oldLength);

    // fill in padding character
    while(--start >= 0) {
      array[start] = padChar;
    }
    setLength(targetLength);
    return TRUE;
  }
}